

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_log_module.c
# Opt level: O0

void ngx_stream_log_write(ngx_stream_session_t *s,ngx_stream_log_t *log,u_char *buf,size_t len)

{
  int err_00;
  void *pvVar1;
  long lVar2;
  int *piVar3;
  ngx_stream_log_buf_t *buffer;
  u_char *puStack_40;
  ngx_err_t err;
  ssize_t n;
  time_t now;
  u_char *name;
  size_t len_local;
  u_char *buf_local;
  ngx_stream_log_t *log_local;
  ngx_stream_session_t *s_local;
  
  name = (u_char *)len;
  len_local = (size_t)buf;
  buf_local = (u_char *)log;
  log_local = (ngx_stream_log_t *)s;
  if (log->script == (ngx_stream_log_script_t *)0x0) {
    now = (time_t)(log->file->name).data;
    pvVar1 = log->file->data;
    if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x28) == 0)) {
      puStack_40 = (u_char *)ngx_write_fd(log->file->fd,buf,len);
    }
    else {
      puStack_40 = (u_char *)
                   ngx_stream_log_gzip(log->file->fd,buf,len,*(ngx_int_t *)((long)pvVar1 + 0x28),
                                       s->connection->log);
    }
  }
  else {
    now = 0;
    puStack_40 = (u_char *)ngx_stream_log_script_write(s,log->script,(u_char **)&now,buf,len);
  }
  if (puStack_40 != name) {
    lVar2 = ngx_cached_time->sec;
    if (puStack_40 == (u_char *)0xffffffffffffffff) {
      piVar3 = __errno_location();
      err_00 = *piVar3;
      if (err_00 == 0x1c) {
        *(long *)(buf_local + 0x10) = lVar2;
      }
      if (0x3b < lVar2 - *(long *)(buf_local + 0x18)) {
        if ((void *)0x1 < (log_local->script[5].lengths)->elts) {
          ngx_log_error_core(2,(ngx_log_t *)log_local->script[5].lengths,err_00,
                             "write() to \"%s\" failed",now);
        }
        *(long *)(buf_local + 0x18) = lVar2;
      }
    }
    else if (0x3b < lVar2 - *(long *)(buf_local + 0x18)) {
      if ((void *)0x1 < (log_local->script[5].lengths)->elts) {
        ngx_log_error_core(2,(ngx_log_t *)log_local->script[5].lengths,0,
                           "write() to \"%s\" was incomplete: %z of %uz",now,puStack_40,name);
      }
      *(long *)(buf_local + 0x18) = lVar2;
    }
  }
  return;
}

Assistant:

static void
ngx_stream_log_write(ngx_stream_session_t *s, ngx_stream_log_t *log,
    u_char *buf, size_t len)
{
    u_char                *name;
    time_t                 now;
    ssize_t                n;
    ngx_err_t              err;
#if (NGX_ZLIB)
    ngx_stream_log_buf_t  *buffer;
#endif

    if (log->script == NULL) {
        name = log->file->name.data;

#if (NGX_ZLIB)
        buffer = log->file->data;

        if (buffer && buffer->gzip) {
            n = ngx_stream_log_gzip(log->file->fd, buf, len, buffer->gzip,
                                    s->connection->log);
        } else {
            n = ngx_write_fd(log->file->fd, buf, len);
        }
#else
        n = ngx_write_fd(log->file->fd, buf, len);
#endif

    } else {
        name = NULL;
        n = ngx_stream_log_script_write(s, log->script, &name, buf, len);
    }

    if (n == (ssize_t) len) {
        return;
    }

    now = ngx_time();

    if (n == -1) {
        err = ngx_errno;

        if (err == NGX_ENOSPC) {
            log->disk_full_time = now;
        }

        if (now - log->error_log_time > 59) {
            ngx_log_error(NGX_LOG_ALERT, s->connection->log, err,
                          ngx_write_fd_n " to \"%s\" failed", name);

            log->error_log_time = now;
        }

        return;
    }

    if (now - log->error_log_time > 59) {
        ngx_log_error(NGX_LOG_ALERT, s->connection->log, 0,
                      ngx_write_fd_n " to \"%s\" was incomplete: %z of %uz",
                      name, n, len);

        log->error_log_time = now;
    }
}